

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

TablePrinter * Catch::operator<<(TablePrinter *tp,Duration *value)

{
  ostream *poVar1;
  double dVar2;
  StringRef local_20;
  
  dVar2 = value->m_inNanoseconds;
  switch(value->m_units) {
  case Microseconds:
    dVar2 = dVar2 / 1000.0;
    break;
  case Milliseconds:
    dVar2 = dVar2 / 1000000.0;
    break;
  case Seconds:
    dVar2 = dVar2 / 1000000000.0;
    break;
  case Minutes:
    dVar2 = dVar2 / 60000000000.0;
  }
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  poVar1 = std::operator<<(poVar1,' ');
  local_20.m_size = 2;
  switch(value->m_units) {
  case Nanoseconds:
    local_20.m_start = "ns";
    break;
  case Microseconds:
    local_20.m_start = "us";
    break;
  case Milliseconds:
    local_20.m_start = "ms";
    break;
  case Seconds:
    local_20.m_size = 1;
    local_20.m_start = "s";
    break;
  case Minutes:
    local_20.m_size = 1;
    local_20.m_start = "m";
    break;
  default:
    local_20.m_size = 0x14;
    local_20.m_start = "** internal error **";
  }
  operator<<(poVar1,&local_20);
  return tp;
}

Assistant:

TablePrinter &operator << (TablePrinter &tp, T const &value) {
            tp.m_oss << value;
            return tp;
        }